

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

void __thiscall TextReader::read_token(TextReader *this,char *value)

{
  bool bVar1;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = is_token(this,value);
  if (bVar1) {
    this->current_token_pos_ = this->current_token_pos_ + this->current_token_len_;
    this->current_token_len_ = 0;
    this->current_token_type_ = ttUnknown;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"Expect \"",&local_b1);
    std::__cxx11::string::string((string *)&local_90,value,&local_b2);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::string((string *)&local_b0,"\" token",&local_b3);
    std::operator+(&local_30,&local_50,&local_b0);
    parse_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

inline void read_token(const char* value) {
        if (is_token(value))
            skip_token();
        else
            parse_error(std::string("Expect \"") + std::string(value) + std::string("\" token"));
    }